

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::_q_connected_abstract_socket
          (QHttpNetworkConnectionChannel *this,QAbstractSocket *absSocket)

{
  bool bVar1;
  ConnectionType CVar2;
  QHttpNetworkConnectionPrivate *pQVar3;
  ulong uVar4;
  QObject *obj;
  size_type_conflict sVar5;
  int __fd;
  QHttp2Configuration *in_RSI;
  QHttp2ProtocolHandler *in_RDI;
  long in_FS_OFFSET;
  bool tryProtocolUpgrade;
  QHttpNetworkConnectionPrivate *connectionPrivate;
  bool anyProtocol;
  shared_ptr<QSslContext> socketSslContext;
  undefined4 in_stack_fffffffffffffef8;
  NetworkLayerProtocol in_stack_fffffffffffffefc;
  QHttpNetworkConnectionPrivate *in_stack_ffffffffffffff00;
  QIODevice *in_stack_ffffffffffffff08;
  ConnectionType CVar6;
  QHttpNetworkConnectionPrivate *in_stack_ffffffffffffff10;
  QHttpNetworkReply **member;
  QObject *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff50;
  NetworkLayerProtocol in_stack_ffffffffffffff54;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  QHttp2Configuration *pQVar7;
  QHttp2Configuration *config;
  undefined8 local_60;
  undefined8 local_58;
  __shared_ptr local_50 [16];
  QHostAddress local_40;
  QHostAddress local_38 [2];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = in_RSI;
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb7f5);
  __fd = (int)in_RSI;
  pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb7fd);
  if (pQVar3->networkLayerState == HostLookupPending) {
LAB_002fb826:
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb837);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb83f);
    uVar4 = QTimer::isActive();
    if ((uVar4 & 1) != 0) {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb865);
      QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb86d);
      QTimer::stop();
    }
    if (*(int *)&in_RDI[2].h2Connection == 0) {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb89b);
      pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb8a3);
      pQVar3->networkLayerState = IPv4;
    }
    else if (*(int *)&in_RDI[2].h2Connection == 1) {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb8ce);
      pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb8d6);
      pQVar3->networkLayerState = IPv6;
    }
    else {
      QAbstractSocket::peerAddress((QAbstractSocket *)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff54 = QHostAddress::protocol((QHostAddress *)0x2fb904);
      QHostAddress::~QHostAddress((QHostAddress *)0x2fb915);
      if (in_stack_ffffffffffffff54 == IPv4Protocol) {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb92f);
        pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb937);
        pQVar3->networkLayerState = IPv4;
      }
      else {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb951);
        pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb959);
        pQVar3->networkLayerState = IPv6;
      }
    }
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb975);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb97d);
    QHttpNetworkConnectionPrivate::networkLayerDetected
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb9a1);
    pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb9a9);
    if (1 < pQVar3->activeChannelCount) {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb9c3);
      pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb9cb);
      if ((pQVar3->encrypt & 1U) == 0) {
        QPointer::operator_cast_to_QHttpNetworkConnection_
                  ((QPointer<QHttpNetworkConnection> *)0x2fb9e5);
        QMetaObject::invokeMethod<>
                  (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                   (ConnectionType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      }
    }
  }
  else {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb814);
    pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb81c);
    if (pQVar3->networkLayerState == IPv4or6) goto LAB_002fb826;
    in_stack_ffffffffffffff77 = *(int *)&in_RDI[2].h2Connection == 2;
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fba1f);
    pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fba27);
    if (((pQVar3->networkLayerState == IPv4) && (*(int *)&in_RDI[2].h2Connection != 0)) &&
       ((in_stack_ffffffffffffff77 & 1) == 0)) {
LAB_002fba76:
      CVar6 = (ConnectionType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      close((QHttpNetworkConnectionChannel *)in_RDI,__fd);
      QPointer::operator_cast_to_QHttpNetworkConnection_
                ((QPointer<QHttpNetworkConnection> *)0x2fba91);
      QMetaObject::invokeMethod<>(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,CVar6)
      ;
      goto LAB_002fbeb2;
    }
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fba53);
    pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fba5b);
    if (((pQVar3->networkLayerState == IPv6) && (*(int *)&in_RDI[2].h2Connection != 1)) &&
       ((in_stack_ffffffffffffff77 & 1) == 0)) goto LAB_002fba76;
  }
  config = pQVar7;
  QVariant::QVariant(&local_28,1);
  (**(code **)((pQVar7->d).d.ptr + 0xc))(pQVar7,1,&local_28);
  QVariant::~QVariant(&local_28);
  *(undefined4 *)(in_RDI + 2) = 0;
  bVar1 = QNetworkConnectionMonitor::isEnabled();
  if (bVar1) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbb21);
    pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fbb29);
    bVar1 = QNetworkConnectionMonitor::isMonitoring(&pQVar3->connectionMonitor);
    if (!bVar1) {
      QAbstractSocket::localAddress((QAbstractSocket *)in_stack_ffffffffffffff08);
      QAbstractSocket::peerAddress((QAbstractSocket *)in_stack_ffffffffffffff08);
      bVar1 = QNetworkConnectionMonitor::setTargets(&pQVar3->connectionMonitor,local_38,&local_40);
      QHostAddress::~QHostAddress((QHostAddress *)0x2fbbac);
      QHostAddress::~QHostAddress((QHostAddress *)0x2fbbb9);
      if (bVar1) {
        QNetworkConnectionMonitor::startMonitoring(&pQVar3->connectionMonitor);
      }
    }
  }
  if ((((ulong)(in_RDI->super_QAbstractProtocolHandler).m_channel & 1) == 0) &&
     (((byte)in_RDI[1].super_QObject & 1) == 0)) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbcf3);
    CVar2 = QHttpNetworkConnection::connectionType
                      ((QHttpNetworkConnection *)in_stack_ffffffffffffff00);
    if (CVar2 == ConnectionTypeHTTP2Direct) {
      *(undefined4 *)&(in_RDI->super_QAbstractProtocolHandler).m_reply = 0;
      member = &in_RDI[1].super_QAbstractProtocolHandler.m_reply;
      obj = (QObject *)operator_new(0x58);
      CVar6 = (ConnectionType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      QHttp2ProtocolHandler::QHttp2ProtocolHandler
                (in_RDI,(QHttpNetworkConnectionChannel *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      std::unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>::
      reset((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_> *)
            in_stack_ffffffffffffff00,
            (pointer)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      sVar5 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                        ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                         in_stack_ffffffffffffff00);
      if (0 < sVar5) {
        QPointer::operator_cast_to_QHttpNetworkConnection_
                  ((QPointer<QHttpNetworkConnection> *)0x2fbd8c);
        QMetaObject::invokeMethod<>(obj,(char *)member,CVar6);
      }
    }
    else {
      *(undefined4 *)&(in_RDI->super_QAbstractProtocolHandler).m_reply = 0;
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbdbd);
      CVar2 = QHttpNetworkConnection::connectionType
                        ((QHttpNetworkConnection *)in_stack_ffffffffffffff00);
      if (CVar2 == ConnectionTypeHTTP2) {
        in_stack_ffffffffffffff00 =
             (QHttpNetworkConnectionPrivate *)&in_RDI[1].super_QAbstractProtocolHandler.m_reply;
        in_stack_ffffffffffffff08 = (QIODevice *)operator_new(0x40);
        QHttpProtocolHandler::QHttpProtocolHandler
                  ((QHttpProtocolHandler *)in_stack_ffffffffffffff00,
                   (QHttpNetworkConnectionChannel *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        std::unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>::
        reset((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
               *)in_stack_ffffffffffffff00,
              (pointer)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      *(undefined1 *)&in_RDI[1].super_QAbstractProtocolHandler.m_connection = 0;
      if (in_RDI->h2Connection == (QHttp2Connection *)0x0) {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbe35);
        QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fbe3d);
        QHttpNetworkConnectionPrivate::dequeueRequest
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      if (in_RDI->h2Connection != (QHttp2Connection *)0x0) {
        if (CVar2 == ConnectionTypeHTTP2) {
          QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbe71)
          ;
          QHttpNetworkConnection::http2Parameters
                    ((QHttpNetworkConnection *)in_stack_ffffffffffffff08);
          Http2::appendProtocolUpgradeHeaders
                    (config,(QHttpNetworkRequest *)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
          QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)0x2fbea4);
        }
        sendRequest((QHttpNetworkConnectionChannel *)in_stack_ffffffffffffff00);
      }
    }
  }
  else {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbc03);
    QHttpNetworkConnection::sslContext((QHttpNetworkConnection *)in_stack_ffffffffffffff08);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_50);
    std::shared_ptr<QSslContext>::~shared_ptr((shared_ptr<QSslContext> *)0x2fbc33);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_60 = 0xaaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaaaaaaaaaa;
      QSslSocketPrivate::sslContext((QSslSocket *)in_stack_ffffffffffffff08);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_60);
      if (bVar1) {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fbc97);
        std::shared_ptr<QSslContext>::shared_ptr
                  ((shared_ptr<QSslContext> *)in_stack_ffffffffffffff00,
                   (shared_ptr<QSslContext> *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QHttpNetworkConnection::setSslContext
                  ((QHttpNetworkConnection *)in_stack_ffffffffffffff10,
                   (shared_ptr<QSslContext> *)in_stack_ffffffffffffff08);
        std::shared_ptr<QSslContext>::~shared_ptr((shared_ptr<QSslContext> *)0x2fbcd0);
      }
      std::shared_ptr<QSslContext>::~shared_ptr((shared_ptr<QSslContext> *)0x2fbcdd);
    }
  }
LAB_002fbeb2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::_q_connected_abstract_socket(QAbstractSocket *absSocket)
{
    // For the Happy Eyeballs we need to check if this is the first channel to connect.
    if (connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::HostLookupPending || connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv4or6) {
        if (connection->d_func()->delayedConnectionTimer.isActive())
            connection->d_func()->delayedConnectionTimer.stop();
        if (networkLayerPreference == QAbstractSocket::IPv4Protocol)
            connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
        else if (networkLayerPreference == QAbstractSocket::IPv6Protocol)
            connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        else {
            if (absSocket->peerAddress().protocol() == QAbstractSocket::IPv4Protocol)
                connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            else
                connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        }
        connection->d_func()->networkLayerDetected(networkLayerPreference);
        if (connection->d_func()->activeChannelCount > 1 && !connection->d_func()->encrypt)
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        bool anyProtocol = networkLayerPreference == QAbstractSocket::AnyIPProtocol;
        if (((connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv4)
             && (networkLayerPreference != QAbstractSocket::IPv4Protocol && !anyProtocol))
            || ((connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv6)
                && (networkLayerPreference != QAbstractSocket::IPv6Protocol && !anyProtocol))) {
            close();
            // This is the second connection so it has to be closed and we can schedule it for another request.
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
        //The connections networkLayerState had already been decided.
    }

    // improve performance since we get the request sent by the kernel ASAP
    //absSocket->setSocketOption(QAbstractSocket::LowDelayOption, 1);
    // We have this commented out now. It did not have the effect we wanted. If we want to
    // do this properly, Qt has to combine multiple HTTP requests into one buffer
    // and send this to the kernel in one syscall and then the kernel immediately sends
    // it as one TCP packet because of TCP_NODELAY.
    // However, this code is currently not in Qt, so we rely on the kernel combining
    // the requests into one TCP packet.

    // not sure yet if it helps, but it makes sense
    absSocket->setSocketOption(QAbstractSocket::KeepAliveOption, 1);

    pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningSupportUnknown;

    if (QNetworkConnectionMonitor::isEnabled()) {
        auto connectionPrivate = connection->d_func();
        if (!connectionPrivate->connectionMonitor.isMonitoring()) {
            // Now that we have a pair of addresses, we can start monitoring the
            // connection status to handle its loss properly.
            if (connectionPrivate->connectionMonitor.setTargets(absSocket->localAddress(), absSocket->peerAddress()))
                connectionPrivate->connectionMonitor.startMonitoring();
        }
    }

    // ### FIXME: if the server closes the connection unexpectedly, we shouldn't send the same broken request again!
    //channels[i].reconnectAttempts = 2;
    if (ssl || pendingEncrypt) { // FIXME: Didn't work properly with pendingEncrypt only, we should refactor this into an EncrypingState
#ifndef QT_NO_SSL
        if (!connection->sslContext()) {
            // this socket is making the 1st handshake for this connection,
            // we need to set the SSL context so new sockets can reuse it
            if (auto socketSslContext = QSslSocketPrivate::sslContext(static_cast<QSslSocket*>(absSocket)))
                connection->setSslContext(std::move(socketSslContext));
        }
#endif
    } else if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
        state = QHttpNetworkConnectionChannel::IdleState;
        protocolHandler.reset(new QHttp2ProtocolHandler(this));
        if (h2RequestsToSend.size() > 0) {
            // In case our peer has sent us its settings (window size, max concurrent streams etc.)
            // let's give _q_receiveReply a chance to read them first ('invokeMethod', QueuedConnection).
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
        }
    } else {
        state = QHttpNetworkConnectionChannel::IdleState;
        const bool tryProtocolUpgrade = connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2;
        if (tryProtocolUpgrade) {
            // For HTTP/1.1 it's already created and never reset.
            protocolHandler.reset(new QHttpProtocolHandler(this));
        }
        switchedToHttp2 = false;

        if (!reply)
            connection->d_func()->dequeueRequest(absSocket);

        if (reply) {
            if (tryProtocolUpgrade) {
                // Let's augment our request with some magic headers and try to
                // switch to HTTP/2.
                Http2::appendProtocolUpgradeHeaders(connection->http2Parameters(), &request);
            }
            sendRequest();
        }
    }
}